

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)

{
  SESSION_HANDLE pSVar1;
  LINK_ENDPOINT_INSTANCE **ppLVar2;
  size_t local_48;
  size_t local_40;
  size_t realloc_size;
  LINK_ENDPOINT_INSTANCE **new_endpoints;
  uint32_t i;
  SESSION_INSTANCE *session_instance;
  LINK_ENDPOINT_INSTANCE *endpoint_instance;
  LINK_ENDPOINT_HANDLE link_endpoint_local;
  
  if (link_endpoint != (LINK_ENDPOINT_HANDLE)0x0) {
    pSVar1 = link_endpoint->session;
    for (new_endpoints._4_4_ = 0;
        (new_endpoints._4_4_ < pSVar1->link_endpoint_count &&
        (pSVar1->link_endpoints[new_endpoints._4_4_] != link_endpoint));
        new_endpoints._4_4_ = new_endpoints._4_4_ + 1) {
    }
    if (new_endpoints._4_4_ < pSVar1->link_endpoint_count) {
      if (new_endpoints._4_4_ < pSVar1->link_endpoint_count - 1) {
        memmove(pSVar1->link_endpoints + new_endpoints._4_4_,
                pSVar1->link_endpoints + (new_endpoints._4_4_ + 1),
                (ulong)((pSVar1->link_endpoint_count - new_endpoints._4_4_) - 1) << 3);
      }
      pSVar1->link_endpoint_count = pSVar1->link_endpoint_count - 1;
      if (pSVar1->link_endpoint_count == 0) {
        free(pSVar1->link_endpoints);
        pSVar1->link_endpoints = (LINK_ENDPOINT_INSTANCE **)0x0;
      }
      else {
        if (pSVar1->link_endpoint_count == 0) {
          local_40 = 0;
        }
        else {
          if ((ulong)pSVar1->link_endpoint_count < 0x2000000000000000) {
            local_48 = (ulong)pSVar1->link_endpoint_count << 3;
          }
          else {
            local_48 = 0xffffffffffffffff;
          }
          local_40 = local_48;
        }
        if ((local_40 != 0xffffffffffffffff) &&
           (ppLVar2 = (LINK_ENDPOINT_INSTANCE **)realloc(pSVar1->link_endpoints,local_40),
           ppLVar2 != (LINK_ENDPOINT_INSTANCE **)0x0)) {
          pSVar1->link_endpoints = ppLVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void remove_link_endpoint(LINK_ENDPOINT_HANDLE link_endpoint)
{
    if (link_endpoint != NULL)
    {
        LINK_ENDPOINT_INSTANCE* endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = endpoint_instance->session;
        uint32_t i;

        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            if (session_instance->link_endpoints[i] == link_endpoint)
            {
                break;
            }
        }

        if (i < session_instance->link_endpoint_count)
        {
            LINK_ENDPOINT_INSTANCE** new_endpoints;

            if (i < (session_instance->link_endpoint_count - 1))
            {
                (void)memmove(&session_instance->link_endpoints[i], &session_instance->link_endpoints[i + 1], (session_instance->link_endpoint_count - (uint32_t)i - 1) * sizeof(LINK_ENDPOINT_INSTANCE*));
            }

            session_instance->link_endpoint_count--;

            if (session_instance->link_endpoint_count == 0)
            {
                free(session_instance->link_endpoints);
                session_instance->link_endpoints = NULL;
            }
            else
            {
                size_t realloc_size = safe_multiply_size_t(sizeof(LINK_ENDPOINT_INSTANCE*), session_instance->link_endpoint_count);
                if (realloc_size != SIZE_MAX &&
                    (new_endpoints = (LINK_ENDPOINT_INSTANCE**)realloc(session_instance->link_endpoints, realloc_size)) != NULL)
                {
                    session_instance->link_endpoints = new_endpoints;
                }
            }
        }
    }
}